

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int find_param(VARR_token_t *params,char *name)

{
  int iVar1;
  size_t sVar2;
  token_t ptVar3;
  ulong local_38;
  size_t i;
  token_t param;
  size_t len;
  char *name_local;
  VARR_token_t *params_local;
  
  sVar2 = VARR_token_tlength(params);
  iVar1 = strcmp(name,varg);
  if (((iVar1 == 0) && (sVar2 != 0)) &&
     (ptVar3 = VARR_token_tlast(params), (short)*(undefined4 *)ptVar3 == 0x10f)) {
    return (int)sVar2 + -1;
  }
  local_38 = 0;
  while( true ) {
    if (sVar2 <= local_38) {
      return -1;
    }
    ptVar3 = VARR_token_tget(params,local_38);
    iVar1 = strcmp(ptVar3->repr,name);
    if (iVar1 == 0) break;
    local_38 = local_38 + 1;
  }
  return (int)local_38;
}

Assistant:

static int find_param (VARR (token_t) * params, const char *name) {
  size_t len = VARR_LENGTH (token_t, params);
  token_t param;

  if (strcmp (name, varg) == 0 && len != 0 && VARR_LAST (token_t, params)->code == T_DOTS)
    return (int) len - 1;
  for (size_t i = 0; i < len; i++) {
    param = VARR_GET (token_t, params, i);
    if (strcmp (param->repr, name) == 0) return (int) i;
  }
  return -1;
}